

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> * __thiscall
Clara::CommandLine<Catch::ConfigData>::populateFloatingArgs
          (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  pointer pTVar1;
  IArgFunction<Catch::ConfigData> *pIVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  if ((this->m_arg)._M_ptr == (Arg *)0x0) {
    std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::vector
              (__return_storage_ptr__,tokens);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar3 = 0;
    for (uVar4 = 0;
        pTVar1 = (tokens->
                 super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>).
                 _M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)(((long)(tokens->
                               super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x28);
        uVar4 = uVar4 + 1) {
      if (*(int *)((long)&pTVar1->type + lVar3) == 0) {
        pIVar2 = (((this->m_arg)._M_ptr)->boundField).functionObj;
        (*pIVar2->_vptr_IArgFunction[2])
                  (pIVar2,config,(long)&(pTVar1->data)._M_dataplus._M_p + lVar3);
      }
      else {
        std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::push_back
                  (__return_storage_ptr__,(value_type *)((long)&pTVar1->type + lVar3));
      }
      lVar3 = lVar3 + 0x28;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> populateFloatingArgs( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            if( !m_arg.get() )
                return tokens;
            std::vector<Parser::Token> unusedTokens;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                if( token.type == Parser::Token::Positional )
                    m_arg->boundField.set( config, token.data );
                else
                    unusedTokens.push_back( token );
            }
            return unusedTokens;
        }